

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_1::ImageView::Resources::Resources
          (Resources *this,Environment *env,Parameters *params)

{
  VkResult result;
  Parameters *in_RCX;
  VkMemoryAllocateInfo local_58;
  Move<vk::Handle<(vk::HandleType)7>_> local_38;
  
  Image::create((Move<vk::Handle<(vk::HandleType)9>_> *)&local_58,env,(Resources *)params,in_RCX);
  (this->image).object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)local_58.allocationSize;
  (this->image).object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(local_58._28_4_,local_58.memoryTypeIndex);
  (this->image).object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       CONCAT44(local_58._4_4_,local_58.sType);
  (this->image).object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_58.pNext;
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)&local_58,env->vkd,env->device,
             (VkImage)(this->image).object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal);
  if ((uint)local_58.allocationSize == 0) {
    local_58.memoryTypeIndex = 0x20;
  }
  else {
    local_58.memoryTypeIndex = 0;
    if ((uint)local_58.allocationSize != 0) {
      for (; ((uint)local_58.allocationSize >> local_58.memoryTypeIndex & 1) == 0;
          local_58.memoryTypeIndex = local_58.memoryTypeIndex + 1) {
      }
    }
  }
  local_58.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  local_58.pNext = (void *)0x0;
  ::vk::allocateMemory(&local_38,env->vkd,env->device,&local_58,env->allocationCallbacks);
  *(undefined4 *)
   &(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       local_38.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device._0_4_;
  *(undefined4 *)
   ((long)&(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
           m_device + 4) =
       local_38.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device._4_4_;
  *(undefined4 *)
   &(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       local_38.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator._0_4_;
  *(undefined4 *)
   ((long)&(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
           m_allocator + 4) =
       local_38.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator._4_4_;
  *(undefined4 *)
   &(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
       (undefined4)local_38.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  *(undefined4 *)
   ((long)&(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
           m_internal + 4) =
       local_38.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._4_4_;
  *(undefined4 *)
   &(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface
       = local_38.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface._0_4_;
  *(undefined4 *)
   ((long)&(this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
           m_deviceIface + 4) =
       local_38.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface._4_4_;
  result = (*env->vkd->_vptr_DeviceInterface[0xd])
                     (env->vkd,env->device,
                      (this->image).object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal,
                      (this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.
                      object.m_internal,0);
  ::vk::checkResult(result,"env.vkd.bindImageMemory(env.device, *image.object, *memory.object, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiObjectManagementTests.cpp"
                    ,0x356);
  return;
}

Assistant:

Resources (const Environment& env, const Parameters& params)
			: image	(env, params.image)
			, memory(env, getDeviceMemoryParameters(env, *image.object))
		{
			VK_CHECK(env.vkd.bindImageMemory(env.device, *image.object, *memory.object, 0));
		}